

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topk.cc
# Opt level: O0

void predict_or_learn<false>(topk *d,single_learner *base,multi_ex *ec_seq)

{
  bool bVar1;
  reference ppeVar2;
  size_type sVar3;
  const_reference pvVar4;
  uint *in_RDI;
  example ec;
  example *example;
  iterator __end1;
  iterator __begin1;
  multi_ex *__range1;
  example *in_stack_ffffffffffff9698;
  vw *in_stack_ffffffffffff96a0;
  example *in_stack_ffffffffffff96a8;
  learner<char,_example> *in_stack_ffffffffffff96b0;
  value_type *in_stack_ffffffffffff96b8;
  priority_queue<std::pair<float,_v_array<char>_>,_std::vector<std::pair<float,_v_array<char>_>,_std::allocator<std::pair<float,_v_array<char>_>_>_>,_compare_scored_examples>
  *in_stack_ffffffffffff96c0;
  undefined1 local_6908 [26704];
  float local_b8;
  example *local_38;
  example **local_30;
  __normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_> local_28 [4];
  uint *local_8;
  
  local_8 = in_RDI;
  local_28[0]._M_current =
       (example **)
       std::vector<example_*,_std::allocator<example_*>_>::begin
                 ((vector<example_*,_std::allocator<example_*>_> *)in_stack_ffffffffffff9698);
  local_30 = (example **)
             std::vector<example_*,_std::allocator<example_*>_>::end
                       ((vector<example_*,_std::allocator<example_*>_> *)in_stack_ffffffffffff9698);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>
                             *)in_stack_ffffffffffff96a0,
                            (__normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>
                             *)in_stack_ffffffffffff9698), bVar1) {
    ppeVar2 = __gnu_cxx::
              __normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>::
              operator*(local_28);
    local_38 = *ppeVar2;
    memcpy(local_6908,local_38,0x68d0);
    LEARNER::learner<char,_example>::predict
              (in_stack_ffffffffffff96b0,in_stack_ffffffffffff96a8,(size_t)in_stack_ffffffffffff96a0
              );
    sVar3 = std::
            priority_queue<std::pair<float,_v_array<char>_>,_std::vector<std::pair<float,_v_array<char>_>,_std::allocator<std::pair<float,_v_array<char>_>_>_>,_compare_scored_examples>
            ::size((priority_queue<std::pair<float,_v_array<char>_>,_std::vector<std::pair<float,_v_array<char>_>,_std::allocator<std::pair<float,_v_array<char>_>_>_>,_compare_scored_examples>
                    *)0x2969bd);
    if (sVar3 < *local_8) {
      in_stack_ffffffffffff96a0 = (vw *)(local_8 + 2);
      std::make_pair<float&,v_array<char>&>
                ((float *)in_stack_ffffffffffff96a0,(v_array<char> *)in_stack_ffffffffffff9698);
      std::
      priority_queue<std::pair<float,_v_array<char>_>,_std::vector<std::pair<float,_v_array<char>_>,_std::allocator<std::pair<float,_v_array<char>_>_>_>,_compare_scored_examples>
      ::push(in_stack_ffffffffffff96c0,in_stack_ffffffffffff96b8);
    }
    else {
      pvVar4 = std::
               priority_queue<std::pair<float,_v_array<char>_>,_std::vector<std::pair<float,_v_array<char>_>,_std::allocator<std::pair<float,_v_array<char>_>_>_>,_compare_scored_examples>
               ::top((priority_queue<std::pair<float,_v_array<char>_>,_std::vector<std::pair<float,_v_array<char>_>,_std::allocator<std::pair<float,_v_array<char>_>_>_>,_compare_scored_examples>
                      *)0x296a21);
      if (pvVar4->first < local_b8) {
        std::
        priority_queue<std::pair<float,_v_array<char>_>,_std::vector<std::pair<float,_v_array<char>_>,_std::allocator<std::pair<float,_v_array<char>_>_>_>,_compare_scored_examples>
        ::pop((priority_queue<std::pair<float,_v_array<char>_>,_std::vector<std::pair<float,_v_array<char>_>,_std::allocator<std::pair<float,_v_array<char>_>_>_>,_compare_scored_examples>
               *)in_stack_ffffffffffff96b0);
        in_stack_ffffffffffff9698 = (example *)(local_8 + 2);
        std::make_pair<float&,v_array<char>&>
                  ((float *)in_stack_ffffffffffff96a0,(v_array<char> *)in_stack_ffffffffffff9698);
        std::
        priority_queue<std::pair<float,_v_array<char>_>,_std::vector<std::pair<float,_v_array<char>_>,_std::allocator<std::pair<float,_v_array<char>_>_>_>,_compare_scored_examples>
        ::push(in_stack_ffffffffffff96c0,in_stack_ffffffffffff96b8);
      }
    }
    output_example(in_stack_ffffffffffff96a0,in_stack_ffffffffffff9698);
    __gnu_cxx::__normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>::
    operator++(local_28);
  }
  return;
}

Assistant:

void predict_or_learn(topk& d, LEARNER::single_learner& base, multi_ex& ec_seq)
{
  for (auto example : ec_seq)
  {
    auto ec = *example;

    if (is_learn)
      base.learn(ec);
    else
      base.predict(ec);

    if (d.pr_queue.size() < d.K)
      d.pr_queue.push(make_pair(ec.pred.scalar, ec.tag));
    else if (d.pr_queue.top().first < ec.pred.scalar)
    {
      d.pr_queue.pop();
      d.pr_queue.push(make_pair(ec.pred.scalar, ec.tag));
    }

    output_example(*d.all, ec);
  }
}